

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O0

void __thiscall gvr::MultiTexturedMesh::resizeTriangleList(MultiTexturedMesh *this,int tn)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int *piVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  int in_ESI;
  Mesh *in_RDI;
  int i;
  UVT *p;
  int local_20;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ESI;
  uVar3 = SUB168(auVar2 * ZEXT816(0x1c),0);
  if (SUB168(auVar2 * ZEXT816(0x1c),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  local_20 = Mesh::getTriangleCount(in_RDI);
  piVar5 = std::min<int>(&local_20,(int *)&stack0xfffffffffffffff4);
  local_1c = *piVar5;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    puVar7 = (undefined8 *)
             ((long)in_RDI[1].super_PointCloud.super_Model.Rc.v[0][2] + (long)local_1c * 0x1c);
    puVar6 = (undefined8 *)((long)pvVar4 + (long)local_1c * 0x1c);
    *puVar6 = *puVar7;
    puVar6[1] = puVar7[1];
    puVar6[2] = puVar7[2];
    *(undefined4 *)(puVar6 + 3) = *(undefined4 *)(puVar7 + 3);
  }
  pvVar1 = (void *)in_RDI[1].super_PointCloud.super_Model.Rc.v[0][2];
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  in_RDI[1].super_PointCloud.super_Model.Rc.v[0][2] = (double)pvVar4;
  Mesh::resizeTriangleList
            ((Mesh *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)pvVar4 >> 0x20));
  return;
}

Assistant:

void MultiTexturedMesh::resizeTriangleList(int tn)
{
  UVT *p=new UVT [tn];

  for (int i=std::min(getTriangleCount(), tn)-1; i>=0; i--)
  {
    p[i]=uvt[i];
  }

  delete [] uvt;

  uvt=p;

  Mesh::resizeTriangleList(tn);
}